

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O0

bool __thiscall
HeadersSyncState::ValidateAndStoreRedownloadedHeader(HeadersSyncState *this,CBlockHeader *header)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  size_t sVar5;
  undefined8 in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  bool expected_commitment;
  bool commitment;
  uint32_t previous_nBits;
  int64_t next_height;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  CBlockHeader *in_stack_fffffffffffffde0;
  CBlockIndex *in_stack_fffffffffffffde8;
  base_uint<256U> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  Params *in_stack_fffffffffffffe00;
  LogFlags in_stack_fffffffffffffe40;
  int source_line;
  bool local_1a1;
  ConstevalFormatString<2U> in_stack_fffffffffffffe88;
  string_view in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffea0;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  Level in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff90;
  long *in_stack_ffffffffffffff98;
  
  source_line = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<false,bool>
            ((bool *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             (char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
             (char *)in_stack_fffffffffffffde0,
             (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  if (in_RDI[0x79] == 1) {
    lVar2 = *(long *)(in_RDI + 0x5e);
    bVar3 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffde8,
                         (base_blob<256U> *)in_stack_fffffffffffffde0);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                                  Trace);
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                   (char *)in_stack_fffffffffffffdf0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                   (char *)in_stack_fffffffffffffdf0);
        LogPrintFormatInternal<long,long>
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe90,source_line,0x111c37f,
                   in_stack_ffffffffffffff80,in_stack_fffffffffffffe88,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff98);
      }
      local_1a1 = false;
    }
    else {
      bVar3 = std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::empty
                        ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      if (!bVar3) {
        std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::back
                  ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
                   in_stack_fffffffffffffde8);
      }
      bVar3 = PermittedDifficultyTransition
                        (in_stack_fffffffffffffe00,
                         CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (uint32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffdf0);
      if (bVar3) {
        CBlockIndex::CBlockIndex(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        GetBlockProof(in_stack_fffffffffffffde8);
        base_uint<256U>::operator+=
                  ((base_uint<256U> *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                   in_stack_fffffffffffffdf0);
        bVar3 = operator>=((base_uint<256U> *)in_stack_fffffffffffffde8,
                           (base_uint<256U> *)in_stack_fffffffffffffde0);
        if (bVar3) {
          *(undefined1 *)(in_RDI + 0x78) = 1;
        }
        if (((in_RDI[0x78] & 1) == 0) && ((lVar2 + 1U) % 0x267 == (ulong)*in_RDI)) {
          sVar4 = bitdeque<32768>::size((bitdeque<32768> *)in_stack_fffffffffffffde8);
          if (sVar4 == 0) {
            bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8
                                                ),Trace);
            if (bVar3) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (char *)in_stack_fffffffffffffdf0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (char *)in_stack_fffffffffffffdf0);
              LogPrintFormatInternal<long,long>
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe90,source_line,
                         in_stack_fffffffffffffe40,in_stack_ffffffffffffff80,
                         in_stack_fffffffffffffe88,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff98);
            }
            local_1a1 = false;
            goto LAB_008d83fe;
          }
          CBlockHeader::GetHash
                    ((CBlockHeader *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
          sVar5 = SaltedTxidHasher::operator()
                            ((SaltedTxidHasher *)in_stack_fffffffffffffde8,
                             (uint256 *)in_stack_fffffffffffffde0);
          bitdeque<32768>::front((bitdeque<32768> *)in_stack_fffffffffffffde8);
          bVar3 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffffde8);
          std::bitset<32768UL>::reference::~reference
                    ((reference *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          bitdeque<32768>::pop_front
                    ((bitdeque<32768> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          if (((sVar5 & 1) != 0) != bVar3) {
            bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8
                                                ),Trace);
            if (bVar3) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (char *)in_stack_fffffffffffffdf0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (char *)in_stack_fffffffffffffdf0);
              LogPrintFormatInternal<long,long>
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe90,source_line,
                         in_stack_fffffffffffffe40,in_stack_ffffffffffffff80,
                         in_stack_fffffffffffffe88,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff98);
            }
            local_1a1 = false;
            goto LAB_008d83fe;
          }
        }
        std::deque<CompressedHeader,std::allocator<CompressedHeader>>::
        emplace_back<CBlockHeader_const&>
                  ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
                   in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        *(ulong *)(in_RDI + 0x5e) = lVar2 + 1U;
        CBlockHeader::GetHash
                  ((CBlockHeader *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
        *(undefined8 *)(in_RDI + 0x60) = local_100;
        *(undefined8 *)(in_RDI + 0x62) = local_f8;
        *(undefined8 *)(in_RDI + 100) = local_f0;
        *(undefined8 *)(in_RDI + 0x66) = local_e8;
        local_1a1 = true;
      }
      else {
        bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                                    Trace);
        if (bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
          LogPrintFormatInternal<long,long>
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe90,source_line,
                     in_stack_fffffffffffffe40,in_stack_ffffffffffffff80,in_stack_fffffffffffffe88,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
        }
        local_1a1 = false;
      }
    }
  }
  else {
    local_1a1 = false;
  }
LAB_008d83fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1a1;
}

Assistant:

bool HeadersSyncState::ValidateAndStoreRedownloadedHeader(const CBlockHeader& header)
{
    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return false;

    int64_t next_height = m_redownload_buffer_last_height + 1;

    // Ensure that we're working on a header that connects to the chain we're
    // downloading.
    if (header.hashPrevBlock != m_redownload_buffer_last_hash) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (redownload phase)\n", m_id, next_height);
        return false;
    }

    // Check that the difficulty adjustments are within our tolerance:
    uint32_t previous_nBits{0};
    if (!m_redownloaded_headers.empty()) {
        previous_nBits = m_redownloaded_headers.back().nBits;
    } else {
        previous_nBits = m_chain_start->nBits;
    }

    if (!PermittedDifficultyTransition(m_consensus_params, next_height,
                previous_nBits, header.nBits)) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (redownload phase)\n", m_id, next_height);
        return false;
    }

    // Track work on the redownloaded chain
    m_redownload_chain_work += GetBlockProof(CBlockIndex(header));

    if (m_redownload_chain_work >= m_minimum_required_work) {
        m_process_all_remaining_headers = true;
    }

    // If we're at a header for which we previously stored a commitment, verify
    // it is correct. Failure will result in aborting download.
    // Also, don't check commitments once we've gotten to our target blockhash;
    // it's possible our peer has extended its chain between our first sync and
    // our second, and we don't want to return failure after we've seen our
    // target blockhash just because we ran out of commitments.
    if (!m_process_all_remaining_headers && next_height % HEADER_COMMITMENT_PERIOD == m_commit_offset) {
        if (m_header_commitments.size() == 0) {
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: commitment overrun at height=%i (redownload phase)\n", m_id, next_height);
            // Somehow our peer managed to feed us a different chain and
            // we've run out of commitments.
            return false;
        }
        bool commitment = m_hasher(header.GetHash()) & 1;
        bool expected_commitment = m_header_commitments.front();
        m_header_commitments.pop_front();
        if (commitment != expected_commitment) {
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: commitment mismatch at height=%i (redownload phase)\n", m_id, next_height);
            return false;
        }
    }

    // Store this header for later processing.
    m_redownloaded_headers.emplace_back(header);
    m_redownload_buffer_last_height = next_height;
    m_redownload_buffer_last_hash = header.GetHash();

    return true;
}